

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution_x86_avx512::forward
          (Deconvolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float *pfVar10;
  Mat *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  bool bVar11;
  float fVar12;
  double dVar13;
  float w_2;
  int k;
  float val;
  int sx;
  int sxs;
  int x;
  float *sptr;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  float sum;
  int j;
  int i;
  int outh_1;
  int outw_1;
  int channels;
  int h_1;
  int w_1;
  float *outptr;
  int p;
  int maxk;
  Mat top_blob_bordered;
  size_t out_elemsize;
  int out_elempack;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  size_t elemsize;
  int h;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  Mat *in_stack_00000548;
  Mat *in_stack_00000550;
  Mat *in_stack_00000558;
  Mat *in_stack_00000560;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  int in_stack_00000f40;
  int in_stack_00000f44;
  Mat *in_stack_00000f48;
  Mat *in_stack_00000f50;
  Mat *in_stack_00000f58;
  Mat *in_stack_00000f60;
  int in_stack_00001b80;
  int in_stack_00001b88;
  int in_stack_00001b90;
  int in_stack_00001b98;
  int in_stack_00001ba0;
  Mat *in_stack_00001ba8;
  Option *in_stack_00001bb0;
  int in_stack_00001dc0;
  int in_stack_00001dc8;
  int in_stack_00001dd0;
  int in_stack_00001dd8;
  int in_stack_00001de0;
  Mat *in_stack_00001de8;
  Option *in_stack_00001df0;
  int in_stack_00002020;
  int in_stack_00002028;
  int in_stack_00002030;
  int in_stack_00002038;
  int in_stack_00002040;
  Mat *in_stack_00002048;
  Option *in_stack_00002050;
  int in_stack_00002560;
  int in_stack_00002568;
  int in_stack_00002570;
  int in_stack_00002578;
  int in_stack_00002580;
  Mat *in_stack_00002588;
  Option *in_stack_00002590;
  int in_stack_fffffffffffff8b4;
  undefined4 in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8bc;
  undefined8 in_stack_fffffffffffff8c0;
  undefined8 in_stack_fffffffffffff8c8;
  Mat *in_stack_fffffffffffff8d0;
  Mat *in_stack_fffffffffffff8d8;
  Mat *in_stack_fffffffffffff8e0;
  undefined8 *puVar14;
  undefined7 in_stack_fffffffffffff8e8;
  undefined1 in_stack_fffffffffffff8ef;
  float local_6fc;
  Allocator *in_stack_fffffffffffff930;
  bool local_5e5;
  int local_5c0;
  int local_5bc;
  int local_59c;
  int local_584;
  int in_stack_fffffffffffffab0;
  int in_stack_fffffffffffffab4;
  Mat *in_stack_fffffffffffffab8;
  Mat *in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffacc;
  int iVar15;
  Mat *in_stack_fffffffffffffad0;
  Mat *in_stack_fffffffffffffad8;
  Mat *in_stack_fffffffffffffae0;
  Mat *in_stack_fffffffffffffae8;
  undefined8 in_stack_fffffffffffffb18;
  int *piVar16;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  int iVar17;
  undefined4 in_stack_fffffffffffffb28;
  int iVar18;
  undefined4 in_stack_fffffffffffffb2c;
  int iVar19;
  undefined4 in_stack_fffffffffffffb30;
  int iVar20;
  undefined4 in_stack_fffffffffffffb34;
  int iVar21;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  int iVar22;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  undefined8 uVar23;
  Mat *in_stack_fffffffffffffb58;
  Mat *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  Mat *in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb80;
  Mat *in_stack_fffffffffffffb88;
  void **ppvVar24;
  int in_stack_fffffffffffffb90;
  int iVar25;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  int in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  Mat *top_blob_00;
  Mat *bottom_blob_00;
  Mat *top_blob_01;
  int iVar26;
  Mat *in_stack_fffffffffffffbc0;
  Mat *weight_data_packed;
  int iVar27;
  int iVar28;
  int local_420;
  size_t local_418;
  int local_408;
  Mat *pMVar29;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  int in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  Mat *in_stack_fffffffffffffd10;
  Mat *in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  Mat *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  Mat *in_stack_fffffffffffffd40;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  long *local_1c8;
  undefined4 local_1c0;
  float local_1bc [3];
  long *local_1b0;
  undefined8 local_1a8;
  long *local_1a0;
  undefined8 local_198;
  long *local_190;
  undefined8 local_188;
  long *local_180;
  undefined8 local_178;
  long *local_170;
  undefined8 local_168;
  undefined4 local_15c;
  undefined8 local_158;
  int *local_150;
  undefined4 local_144;
  int local_140;
  int local_13c;
  undefined1 *local_138;
  Allocator *local_130;
  int local_124;
  size_t local_120;
  void *local_118;
  int local_10c;
  int local_108;
  int local_104;
  undefined8 in_stack_ffffffffffffff00;
  Mat *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  Mat *in_stack_ffffffffffffff18;
  Mat *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  Mat *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff90;
  Mat *in_stack_ffffffffffffff98;
  Mat *in_stack_ffffffffffffffa0;
  Mat *in_stack_ffffffffffffffa8;
  Mat *in_stack_ffffffffffffffb0;
  
  iVar22 = (int)((ulong)in_stack_fffffffffffff8c0 >> 0x20);
  uVar23 = CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50);
  iVar25 = in_RSI->elempack;
  iVar2 = *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4);
  iVar3 = *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4);
  iVar4 = *(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18));
  iVar5 = *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18));
  local_408 = 1;
  if (((ulong)in_RCX->allocator & 0x100000000000000) != 0) {
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) % 0x10 == 0) {
      local_5bc = 0x10;
    }
    else {
      if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) % 8 == 0) {
        local_5c0 = 8;
      }
      else {
        local_5c0 = 1;
        if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) % 4 == 0) {
          local_5c0 = 4;
        }
      }
      local_5bc = local_5c0;
    }
    local_408 = local_5bc;
  }
  top_blob_00 = (Mat *)0x0;
  bottom_blob_00 = (Mat *)0x0;
  top_blob_01 = (Mat *)0x0;
  iVar26 = 0;
  weight_data_packed = (Mat *)0x0;
  iVar26 = 0;
  iVar20 = 0;
  iVar19 = 0;
  iVar21 = 0;
  local_420 = 0;
  local_418 = 0;
  iVar7 = (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20);
  pMVar29 = in_RDI;
  if ((((*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18) + 4) < 1) &&
       (*(int *)((long)&in_RDI[3].elempack + *(long *)((long)in_RDI->data + -0x18)) < 1)) &&
      (*(int *)(&in_RDI[3].field_0x1c + *(long *)((long)in_RDI->data + -0x18)) < 1)) &&
     ((*(int *)((long)&in_RDI[3].allocator + *(long *)((long)in_RDI->data + -0x18)) < 1 &&
      ((*(int *)((long)&in_RDI[3].w + *(long *)((long)in_RDI->data + -0x18)) < 1 ||
       (*(int *)((long)&in_RDI[3].h + *(long *)((long)in_RDI->data + -0x18)) < 1)))))) {
    if ((Mat *)&stack0xfffffffffffffba8 != in_RDX) {
      if (in_RDX->refcount != (int *)0x0) {
        LOCK();
        *in_RDX->refcount = *in_RDX->refcount + 1;
        UNLOCK();
      }
      iVar26 = 0;
      top_blob_00 = (Mat *)in_RDX->data;
      bottom_blob_00 = (Mat *)in_RDX->refcount;
      top_blob_01 = (Mat *)in_RDX->elemsize;
      iVar26 = in_RDX->elempack;
      weight_data_packed = (Mat *)in_RDX->allocator;
      iVar26 = in_RDX->dims;
      iVar20 = in_RDX->w;
      iVar19 = in_RDX->h;
      iVar21 = in_RDX->d;
      local_420 = in_RDX->c;
      local_418 = in_RDX->cstep;
    }
    Mat::create(in_stack_fffffffffffff8d0,iVar7,(int)in_stack_fffffffffffff8c8,iVar22,
                CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                in_stack_fffffffffffff8b4,in_stack_fffffffffffff930);
  }
  else {
    Mat::create(in_stack_fffffffffffff8d0,iVar7,(int)in_stack_fffffffffffff8c8,iVar22,
                CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                in_stack_fffffffffffff8b4,in_stack_fffffffffffff930);
  }
  local_5e5 = top_blob_00 == (Mat *)0x0 || local_418 * (long)local_420 == 0;
  if (local_5e5) {
    iVar25 = -100;
  }
  else {
    iVar7 = *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) *
            *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18));
    iVar22 = (int)in_RDI;
    if ((iVar25 == 0x10) && (local_408 == 0x10)) {
      lVar6 = *(long *)((long)in_RDI->data + -0x18);
      deconvolution_pack16_avx512
                (in_stack_00000f60,in_stack_00000f58,in_stack_00000f50,in_stack_00000f48,
                 in_stack_00000f44,in_stack_00000f40,*(int *)((long)&in_RDI[3].refcount + lVar6),
                 *(int *)((long)&in_RDI[3].refcount + lVar6 + 4),
                 *(int *)((long)&in_RDI[3].elemsize + lVar6),*(int *)(&in_RDI[3].field_0x3c + lVar6)
                 ,iVar22 + 0x118 + (int)lVar6,in_RCX,(Option *)in_stack_fffffffffffff8d0);
    }
    if ((iVar25 == 8) && (local_408 == 0x10)) {
      lVar6 = *(long *)((long)in_RDI->data + -0x18);
      deconvolution_pack8to16_avx512
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                 (int)in_stack_ffffffffffffff00,*(int *)((long)&in_RDI[3].refcount + lVar6),
                 *(int *)((long)&in_RDI[3].refcount + lVar6 + 4),
                 *(int *)((long)&in_RDI[3].elemsize + lVar6),*(int *)(&in_RDI[3].field_0x3c + lVar6)
                 ,iVar22 + 0x118 + (int)lVar6,in_RCX,(Option *)in_stack_fffffffffffff8d0);
    }
    iVar28 = (int)in_stack_ffffffffffffff20;
    iVar27 = (int)in_stack_ffffffffffffff18;
    if ((iVar25 == 0x10) && (local_408 == 8)) {
      lVar6 = *(long *)((long)in_RDI->data + -0x18);
      deconvolution_pack16to8_avx512
                (in_stack_00000560,in_stack_00000558,in_stack_00000550,in_stack_00000548,m_1._4_4_,
                 (int)m_1,*(int *)((long)&in_RDI[3].refcount + lVar6),
                 *(int *)((long)&in_RDI[3].refcount + lVar6 + 4),
                 *(int *)((long)&in_RDI[3].elemsize + lVar6),*(int *)(&in_RDI[3].field_0x3c + lVar6)
                 ,iVar22 + 0x118 + (int)lVar6,in_RCX,(Option *)in_stack_fffffffffffff8d0);
    }
    if ((iVar25 == 4) && (local_408 == 0x10)) {
      lVar6 = *(long *)((long)in_RDI->data + -0x18);
      deconvolution_pack4to16_avx512
                ((Mat *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                 in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                 (Mat *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 in_stack_fffffffffffffd04,in_stack_fffffffffffffd00,
                 *(int *)((long)&in_RDI[3].refcount + lVar6),
                 *(int *)((long)&in_RDI[3].refcount + lVar6 + 4),
                 *(int *)((long)&in_RDI[3].elemsize + lVar6),*(int *)(&in_RDI[3].field_0x3c + lVar6)
                 ,iVar22 + 0x118 + (int)lVar6,in_RCX,(Option *)in_stack_fffffffffffff8d0);
    }
    if ((iVar25 == 0x10) && (local_408 == 4)) {
      deconvolution_pack16to4_avx512
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                 (int)in_stack_ffffffffffffff90,in_stack_00002560,in_stack_00002568,
                 in_stack_00002570,in_stack_00002578,in_stack_00002580,in_stack_00002588,
                 in_stack_00002590);
    }
    if ((iVar25 == 1) && (local_408 == 0x10)) {
      lVar6 = *(long *)((long)in_RDI->data + -0x18);
      deconvolution_pack1to16_avx512
                ((Mat *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                 (Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (Mat *)CONCAT44(iVar7,in_stack_fffffffffffffb90),in_stack_fffffffffffffb88,
                 (int)((ulong)in_stack_fffffffffffffb80 >> 0x20),(int)in_stack_fffffffffffffb80,
                 *(int *)((long)&in_RDI[3].refcount + lVar6),
                 *(int *)((long)&in_RDI[3].refcount + lVar6 + 4),
                 *(int *)((long)&in_RDI[3].elemsize + lVar6),*(int *)(&in_RDI[3].field_0x3c + lVar6)
                 ,iVar22 + 0x118 + (int)lVar6,in_RCX,(Option *)in_stack_fffffffffffff8d0);
    }
    if ((iVar25 == 0x10) && (local_408 == 1)) {
      lVar6 = *(long *)((long)in_RDI->data + -0x18);
      deconvolution_pack16to1_avx512
                ((Mat *)CONCAT44(iVar21,iVar19),(Mat *)CONCAT44(iVar20,iVar26),weight_data_packed,
                 in_stack_fffffffffffffbc0,(int)((ulong)top_blob_01 >> 0x20),(int)top_blob_01,
                 *(int *)((long)&in_RDI[3].refcount + lVar6),
                 *(int *)((long)&in_RDI[3].refcount + lVar6 + 4),
                 *(int *)((long)&in_RDI[3].elemsize + lVar6),*(int *)(&in_RDI[3].field_0x3c + lVar6)
                 ,iVar22 + 0x118 + (int)lVar6,in_RCX,(Option *)in_stack_fffffffffffff8d0);
    }
    if ((iVar25 == 8) && (local_408 == 8)) {
      lVar6 = *(long *)((long)in_RDI->data + -0x18);
      deconvolution_pack8_avx
                (in_stack_fffffffffffffd40,
                 (Mat *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30,
                 (Mat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                 in_stack_fffffffffffffd24,in_stack_fffffffffffffd20,
                 *(int *)((long)&in_RDI[3].refcount + lVar6),
                 *(int *)((long)&in_RDI[3].refcount + lVar6 + 4),
                 *(int *)((long)&in_RDI[3].elemsize + lVar6),*(int *)(&in_RDI[3].field_0x3c + lVar6)
                 ,iVar22 + 0x118 + (int)lVar6,in_RCX,(Option *)in_stack_fffffffffffff8d0);
    }
    if ((iVar25 == 4) && (local_408 == 8)) {
      lVar6 = *(long *)((long)in_RDI->data + -0x18);
      deconvolution_pack4to8_avx
                ((Mat *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),pMVar29,in_RSI
                 ,in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                 *(int *)((long)&in_RDI[3].refcount + lVar6),
                 *(int *)((long)&in_RDI[3].refcount + lVar6 + 4),
                 *(int *)((long)&in_RDI[3].elemsize + lVar6),*(int *)(&in_RDI[3].field_0x3c + lVar6)
                 ,iVar22 + 0x118 + (int)lVar6,in_RCX,(Option *)in_stack_fffffffffffff8d0);
    }
    if ((iVar25 == 8) && (local_408 == 4)) {
      deconvolution_pack8to4_avx
                (bottom_blob_00,top_blob_00,
                 (Mat *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                 (Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),iVar7,
                 in_stack_fffffffffffffb90,in_stack_00002020,in_stack_00002028,in_stack_00002030,
                 in_stack_00002038,in_stack_00002040,in_stack_00002048,in_stack_00002050);
    }
    if ((iVar25 == 1) && (local_408 == 8)) {
      lVar6 = *(long *)((long)in_RDI->data + -0x18);
      deconvolution_pack1to8_avx
                (in_stack_fffffffffffffbc0,top_blob_01,bottom_blob_00,top_blob_00,
                 in_stack_fffffffffffffba4,in_stack_fffffffffffffba0,
                 *(int *)((long)&in_RDI[3].refcount + lVar6),
                 *(int *)((long)&in_RDI[3].refcount + lVar6 + 4),
                 *(int *)((long)&in_RDI[3].elemsize + lVar6),*(int *)(&in_RDI[3].field_0x3c + lVar6)
                 ,iVar22 + 0x118 + (int)lVar6,in_RCX,(Option *)in_stack_fffffffffffff8d0);
    }
    if ((iVar25 == 8) && (local_408 == 1)) {
      lVar6 = *(long *)((long)in_RDI->data + -0x18);
      deconvolution_pack8to1_avx
                ((Mat *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (Mat *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (Mat *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                 (Mat *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                 (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),(int)in_stack_fffffffffffffb18,
                 *(int *)((long)&in_RDI[3].refcount + lVar6),
                 *(int *)((long)&in_RDI[3].refcount + lVar6 + 4),
                 *(int *)((long)&in_RDI[3].elemsize + lVar6),*(int *)(&in_RDI[3].field_0x3c + lVar6)
                 ,iVar22 + 0x118 + (int)lVar6,in_RCX,(Option *)in_stack_fffffffffffff8d0);
    }
    if ((iVar25 == 4) && (local_408 == 4)) {
      deconvolution_pack4_sse
                (in_stack_fffffffffffffb70,
                 (Mat *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                 in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,(int)((ulong)uVar23 >> 0x20),
                 (int)uVar23,in_stack_00001dc0,in_stack_00001dc8,in_stack_00001dd0,in_stack_00001dd8
                 ,in_stack_00001de0,in_stack_00001de8,in_stack_00001df0);
    }
    if ((iVar25 == 1) && (local_408 == 4)) {
      deconvolution_pack1to4_sse
                (in_stack_fffffffffffffad0,
                 (Mat *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                 in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab4,
                 in_stack_fffffffffffffab0,in_stack_00001b80,in_stack_00001b88,in_stack_00001b90,
                 in_stack_00001b98,in_stack_00001ba0,in_stack_00001ba8,in_stack_00001bb0);
    }
    if ((iVar25 == 4) && (local_408 == 1)) {
      deconvolution_pack4to1_sse
                (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                 in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac8,
                 in_stack_ffffffffffffff10,iVar27,iVar28,in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                 (Option *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    }
    if ((iVar25 == 1) && (local_408 == 1)) {
      for (iVar25 = 0;
          iVar25 < *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18));
          iVar25 = iVar25 + 1) {
        ppvVar24 = (void **)((long)&top_blob_00->data + local_418 * (long)iVar25 * (long)top_blob_01
                            );
        iVar22 = in_RSI->w;
        iVar26 = in_RSI->h;
        iVar21 = in_RSI->c;
        iVar27 = iVar20;
        iVar28 = iVar19;
        for (iVar18 = 0; iVar18 < iVar19; iVar18 = iVar18 + 1) {
          for (iVar17 = 0; iVar17 < iVar20; iVar17 = iVar17 + 1) {
            local_6fc = 0.0;
            if (*(int *)((long)&in_RDI[3].d + *(long *)((long)in_RDI->data + -0x18)) != 0) {
              local_6fc = *(float *)(*(long *)((long)&in_RDI[5].cstep +
                                              *(long *)((long)in_RDI->data + -0x18)) +
                                    (long)iVar25 * 4);
            }
            local_13c = in_RDI->d;
            local_140 = in_RDI->c;
            local_144 = *(undefined4 *)&in_RDI->field_0x3c;
            local_150 = (int *)((long)in_RDI->refcount +
                               (long)in_RDI[1].data * (long)iVar25 * *(long *)&in_RDI->elempack);
            local_158 = *(undefined8 *)&in_RDI->elempack;
            local_15c = *(undefined4 *)&in_RDI->allocator;
            local_168._0_4_ = in_RDI->dims;
            local_168._4_4_ = in_RDI->w;
            local_138 = &stack0xfffffffffffffad0;
            piVar16 = local_150;
            for (iVar15 = 0; iVar15 < iVar21; iVar15 = iVar15 + 1) {
              local_104 = in_RSI->w;
              local_108 = in_RSI->h;
              local_10c = in_RSI->d;
              local_118 = (void *)((long)in_RSI->data +
                                  in_RSI->cstep * (long)iVar15 * in_RSI->elemsize);
              local_120 = in_RSI->elemsize;
              local_124 = in_RSI->elempack;
              local_130 = in_RSI->allocator;
              for (local_584 = 0;
                  local_584 <
                  *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18));
                  local_584 = local_584 + 1) {
                iVar8 = (iVar18 + local_584 *
                                  *(int *)((long)&in_RDI[3].refcount +
                                          *(long *)((long)in_RDI->data + -0x18))) -
                        iVar4 * (iVar5 + -1);
                if (((-1 < iVar8) &&
                    (iVar8 % *(int *)((long)&in_RDI[3].elemsize +
                                     *(long *)((long)in_RDI->data + -0x18)) == 0)) &&
                   (iVar8 = iVar8 / *(int *)((long)&in_RDI[3].elemsize +
                                            *(long *)((long)in_RDI->data + -0x18)), iVar8 < iVar26))
                {
                  for (local_59c = 0;
                      local_59c <
                      *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4);
                      local_59c = local_59c + 1) {
                    iVar9 = (iVar17 + local_59c *
                                      *(int *)((long)&in_RDI[3].data +
                                              *(long *)((long)in_RDI->data + -0x18) + 4)) -
                            iVar2 * (iVar3 + -1);
                    if (((-1 < iVar9) &&
                        (iVar9 % *(int *)((long)&in_RDI[3].refcount +
                                         *(long *)((long)in_RDI->data + -0x18) + 4) == 0)) &&
                       (iVar9 = iVar9 / *(int *)((long)&in_RDI[3].refcount +
                                                *(long *)((long)in_RDI->data + -0x18) + 4),
                       iVar9 < iVar22)) {
                      local_6fc = *(float *)((long)local_118 +
                                            (long)iVar9 * 4 +
                                            (long)local_104 * (long)iVar8 * local_120) *
                                  (float)piVar16[local_584 *
                                                 *(int *)((long)&in_RDI[2].cstep +
                                                         *(long *)((long)in_RDI->data + -0x18) + 4)
                                                 + local_59c] + local_6fc;
                    }
                  }
                }
              }
              piVar16 = piVar16 + iVar7;
            }
            lVar6 = *(long *)((long)in_RDI->data + -0x18);
            local_1c0 = *(undefined4 *)(&in_RDI[3].field_0x3c + lVar6);
            local_1c8 = (long *)((long)&in_RDI[3].cstep + lVar6);
            local_1bc[0] = local_6fc;
            switch(local_1c0) {
            case 1:
              dVar13 = std::fmax((double)(ulong)(uint)local_6fc,0.0);
              local_1bc[0] = SUB84(dVar13,0);
              break;
            case 2:
              local_178 = 0;
              local_1cc = *(float *)*local_1c8;
              if (local_6fc <= 0.0) {
                local_6fc = local_6fc * local_1cc;
              }
              local_1bc[0] = local_6fc;
              local_170 = local_1c8;
              break;
            case 3:
              local_188 = 0;
              local_1d0 = *(float *)*local_1c8;
              local_198 = 1;
              local_1d4 = *(float *)(*local_1c8 + 4);
              if (local_6fc < local_1d0) {
                local_1bc[0] = local_1d0;
              }
              local_190 = local_1c8;
              local_180 = local_1c8;
              if (local_1d4 < local_1bc[0]) {
                local_1bc[0] = local_1d4;
              }
              break;
            case 4:
              local_1d8 = 88.37626;
              pfVar10 = std::min<float>(local_1bc,&local_1d8);
              local_1bc[0] = *pfVar10;
              local_1dc = -88.37626;
              pfVar10 = std::max<float>(local_1bc,&local_1dc);
              local_1bc[0] = *pfVar10;
              dVar13 = std::exp((double)(ulong)(uint)-local_1bc[0]);
              local_1bc[0] = 1.0 / (SUB84(dVar13,0) + 1.0);
              break;
            case 5:
              dVar13 = std::exp((double)(ulong)(uint)local_6fc);
              dVar13 = std::log((double)(ulong)(uint)(SUB84(dVar13,0) + 1.0));
              dVar13 = std::tanh(dVar13);
              local_1bc[0] = local_6fc * SUB84(dVar13,0);
              break;
            case 6:
              local_1a8 = 0;
              fVar1 = *(float *)*local_1c8;
              local_1bc[1] = 1.4013e-45;
              local_1bc[2] = 0.0;
              fVar12 = -*(float *)(*local_1c8 + 4) / fVar1;
              local_1b0 = local_1c8;
              local_1a0 = local_1c8;
              if (fVar12 <= local_6fc) {
                if (local_6fc <= 1.0 / fVar1 + fVar12) {
                  local_1bc[0] = local_6fc * (local_6fc * fVar1 + *(float *)(*local_1c8 + 4));
                }
              }
              else {
                local_1bc[0] = 0.0;
              }
            }
            *(float *)((long)ppvVar24 + (long)iVar17 * 4) = local_1bc[0];
          }
          ppvVar24 = (void **)((long)ppvVar24 + (long)iVar20 * 4);
        }
        iVar20 = iVar27;
        iVar19 = iVar28;
      }
    }
    Deconvolution::cut_padding
              ((Deconvolution *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
               in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
               (Option *)in_stack_fffffffffffff8d0);
    bVar11 = true;
    if (in_RDX->data != (void *)0x0) {
      bVar11 = in_RDX->cstep * (long)in_RDX->c == 0;
    }
    if (bVar11) {
      iVar25 = -100;
    }
    else {
      iVar25 = 0;
    }
  }
  puVar14 = (undefined8 *)&stack0xfffffffffffffba8;
  if (bottom_blob_00 != (Mat *)0x0) {
    LOCK();
    iVar2 = *(int *)&bottom_blob_00->data;
    *(int *)&bottom_blob_00->data = *(int *)&bottom_blob_00->data + -1;
    UNLOCK();
    if (iVar2 == 1) {
      if (weight_data_packed == (Mat *)0x0) {
        if (top_blob_00 != (Mat *)0x0) {
          free(top_blob_00);
        }
      }
      else {
        (**(code **)((long)weight_data_packed->data + 0x18))(weight_data_packed,top_blob_00);
      }
    }
  }
  *puVar14 = 0;
  puVar14[2] = 0;
  *(undefined4 *)(puVar14 + 3) = 0;
  *(undefined4 *)(puVar14 + 5) = 0;
  *(undefined4 *)((long)puVar14 + 0x2c) = 0;
  *(undefined4 *)(puVar14 + 6) = 0;
  *(undefined4 *)((long)puVar14 + 0x34) = 0;
  *(undefined4 *)(puVar14 + 7) = 0;
  puVar14[8] = 0;
  puVar14[1] = 0;
  return iVar25;
}

Assistant:

int Deconvolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}